

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::MpRepeatedMessageOrGroup<true,true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ushort type_card;
  uint32_t uVar3;
  TcParseTableBase *pTVar4;
  uint64_t uVar5;
  uint uVar6;
  FieldEntry *pFVar7;
  string *psVar8;
  void *x;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar9;
  MessageLite *msg_00;
  ushort *p;
  ulong uVar10;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  char *pcVar11;
  uint *puVar12;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar13;
  size_type sVar14;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *extraout_RDX_01;
  ParseContext *extraout_RDX_02;
  ParseContext *ctx_00;
  undefined8 uVar15;
  int v1;
  uint32_t uVar16;
  RepeatedPtrFieldBase *out;
  pointer pcVar17;
  uint32_t next_tag;
  TcParseTableBase *local_68;
  MessageLite *local_60;
  uint64_t local_58;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_50;
  uint local_48 [4];
  RepeatedPtrFieldBase *local_38;
  
  local_68 = table;
  local_50 = data.field_0;
  pFVar7 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                     (table,(ulong)data.field_0 >> 0x20);
  type_card = pFVar7->type_card;
  local_48[0] = type_card & 0x30;
  next_tag = CONCAT22(next_tag._2_2_,0x20);
  psVar8 = absl::lts_20240722::log_internal::Check_EQImpl<int,unsigned_short>
                     ((int *)local_48,(unsigned_short *)&next_tag,
                      "type_card & field_layout::kFcMask == static_cast<uint16_t>(field_layout::kFcRepeated)"
                     );
  if (psVar8 == (string *)0x0) {
    local_48[0] = type_card & 0x1c0;
    next_tag = CONCAT22(next_tag._2_2_,0x40);
    psVar8 = absl::lts_20240722::log_internal::Check_EQImpl<int,unsigned_short>
                       ((int *)local_48,(unsigned_short *)&next_tag,
                        "type_card & field_layout::kRepMask == static_cast<uint16_t>(field_layout::kRepGroup)"
                       );
    pTVar4 = local_68;
    if (psVar8 == (string *)0x0) {
      if (((uint)local_50.data & 7) == 3) {
        local_58 = hasbits;
        x = MaybeGetSplitBase(msg,true,local_68);
        local_60 = msg;
        local_38 = MaybeCreateRepeatedRefAt<google::protobuf::internal::RepeatedPtrFieldBase,true>
                             (x,(ulong)pFVar7->offset,msg);
        aVar9 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                GetTableFromAux(type_card,
                                *(FieldAux *)
                                 ((long)&pTVar4->has_bits_offset +
                                 (ulong)pFVar7->aux_idx * 8 + (ulong)pTVar4->aux_offset));
        do {
          out = local_38;
          msg_00 = AddMessage((TcParseTableBase *)aVar9,local_38);
          uVar6 = ctx->depth_;
          aVar13.data._4_4_ = 0;
          aVar13.data._0_4_ = uVar6;
          ctx->depth_ = uVar6 - 1;
          ctx_00 = extraout_RDX;
          if ((int)uVar6 < 1) {
LAB_00158cdf:
            pcVar11 = Error(local_60,(char *)out,ctx_00,(TcFieldData)aVar13,local_68,local_58);
            return pcVar11;
          }
          v1 = ctx->group_depth_ + 1;
          ctx->group_depth_ = v1;
          aVar13 = aVar9;
          p = (ushort *)ParseLoopPreserveNone(msg_00,ptr,ctx,(TcParseTableBase *)aVar9);
          ctx_00 = extraout_RDX_00;
          out = (RepeatedPtrFieldBase *)ptr;
          if (p != (ushort *)0x0) {
            psVar8 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                               (uVar6 - 1,ctx->depth_,"old_depth == depth_");
            if (psVar8 != (string *)0x0) {
              pcVar17 = (psVar8->_M_dataplus)._M_p;
              sVar14 = psVar8->_M_string_length;
              pcVar11 = 
              "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/parse_context.h"
              ;
              uVar15 = 0x45b;
              goto LAB_00158d6c;
            }
            out = (RepeatedPtrFieldBase *)(ulong)(uint)ctx->group_depth_;
            psVar8 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                               (v1,ctx->group_depth_,"old_group_depth == group_depth_");
            ctx_00 = extraout_RDX_01;
            if (psVar8 != (string *)0x0) {
              pcVar17 = (psVar8->_M_dataplus)._M_p;
              sVar14 = psVar8->_M_string_length;
              pcVar11 = 
              "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/parse_context.h"
              ;
              uVar15 = 0x45c;
              goto LAB_00158d6c;
            }
          }
          uVar3 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
          uVar1 = ctx->depth_;
          uVar2 = ctx->group_depth_;
          ctx->depth_ = uVar1 + 1;
          ctx->group_depth_ = uVar2 + -1;
          if ((p == (ushort *)0x0) || (uVar16 = (uint32_t)local_50.data, uVar3 != uVar16))
          goto LAB_00158cdf;
          if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) goto LAB_00158d01;
          out = (RepeatedPtrFieldBase *)&next_tag;
          ptr = ReadTag((char *)p,(uint32_t *)out,0);
          ctx_00 = extraout_RDX_02;
          if ((RepeatedPtrFieldBase *)ptr == (RepeatedPtrFieldBase *)0x0) goto LAB_00158cdf;
        } while (next_tag == uVar16);
        if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) {
LAB_00158d01:
          uVar5 = local_58;
          if (local_68->has_bits_offset != 0) {
            puVar12 = RefAt<unsigned_int>(local_60,(ulong)local_68->has_bits_offset);
            *puVar12 = *puVar12 | (uint)uVar5;
          }
          return (char *)p;
        }
        uVar6 = (uint)local_68->fast_idx_mask & (uint)*p;
        if ((uVar6 & 7) != 0) {
          protobuf_assumption_failed
                    ("(idx & 7) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                     ,0x44d);
        }
        uVar10 = (ulong)(uVar6 & 0xfffffff8);
        UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&local_68[1].has_bits_offset + uVar10);
        aVar9.data = (ulong)*p ^ *(ulong *)(&local_68[1].fast_idx_mask + uVar10 * 2);
        ptr = (char *)p;
        msg = local_60;
        hasbits = local_58;
      }
      else {
        UNRECOVERED_JUMPTABLE = local_68->fallback;
        aVar9 = local_50;
      }
      pcVar11 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,(TcFieldData)aVar9.data,local_68,hasbits);
      return pcVar11;
    }
    pcVar17 = (psVar8->_M_dataplus)._M_p;
    sVar14 = psVar8->_M_string_length;
    pcVar11 = 
    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
    ;
    uVar15 = 0x95f;
  }
  else {
    pcVar17 = (psVar8->_M_dataplus)._M_p;
    sVar14 = psVar8->_M_string_length;
    pcVar11 = 
    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
    ;
    uVar15 = 0x952;
  }
LAB_00158d6c:
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_48,pcVar11,uVar15,sVar14,pcVar17);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_48);
}

Assistant:

const char* TcParser::MpRepeatedMessageOrGroup(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  ABSL_DCHECK_EQ(type_card & field_layout::kFcMask,
                 static_cast<uint16_t>(field_layout::kFcRepeated));
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  // Validate wiretype:
  if (!is_group) {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepMessage));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  } else {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepGroup));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_START_GROUP) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  RepeatedPtrFieldBase& field =
      MaybeCreateRepeatedRefAt<RepeatedPtrFieldBase, is_split>(
          base, entry.offset, msg);
  const TcParseTableBase* inner_table =
      GetTableFromAux(type_card, *table->field_aux(&entry));

  const char* ptr2 = ptr;
  uint32_t next_tag;
  do {
    MessageLite* value = AddMessage(inner_table, field);
    const auto inner_loop = [&](const char* ptr) {
      return ParseLoopPreserveNone(value, ptr, ctx, inner_table);
    };
    ptr = is_group ? ctx->ParseGroupInlined(ptr2, decoded_tag, inner_loop)
                   : ctx->ParseLengthDelimitedInlined(ptr2, inner_loop);
    if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (PROTOBUF_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}